

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::If_AST_Node::eval_internal(If_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  int iVar2;
  Dispatch_Engine *pDVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar6;
  Dispatch_State *t_e;
  ulong uVar7;
  Boxed_Value BVar8;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  if (bVar1) {
    t_e = *(Dispatch_State **)
           ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex +
           0x10);
LAB_001a670c:
    BVar8 = AST_Node::eval(&this->super_AST_Node,t_e);
    _Var5._M_pi = BVar8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    pDVar3 = t_ss[3].m_engine._M_data;
    if (0x20 < (ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar3)) {
      uVar7 = 2;
      lVar6 = 0;
      do {
        iVar2 = std::__cxx11::string::compare
                          ((char *)(*(long *)((long)&(pDVar3->m_mutex).super_mutex.
                                                     super___mutex_base._M_mutex + lVar6 + 0x20) +
                                   0x20));
        pDVar3 = t_ss[3].m_engine._M_data;
        if (iVar2 == 0) {
          t_e = *(Dispatch_State **)
                 ((long)&(pDVar3->m_conversions).m_mutex.super_mutex.super___mutex_base._M_mutex +
                 lVar6 + 8);
          goto LAB_001a670c;
        }
        iVar2 = std::__cxx11::string::compare
                          ((char *)(*(long *)((long)&(pDVar3->m_mutex).super_mutex.
                                                     super___mutex_base._M_mutex + lVar6 + 0x20) +
                                   0x20));
        if (iVar2 == 0) {
          AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                         *(Dispatch_State **)
                          ((long)&((t_ss[3].m_engine._M_data)->m_conversions).m_mutex.super_mutex.
                                  super___mutex_base._M_mutex + lVar6 + 8));
          bVar1 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
          if (local_38 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
          }
          if (bVar1) {
            t_e = *(Dispatch_State **)
                   ((long)&((t_ss[3].m_engine._M_data)->m_conversions).m_mutex.super_mutex.
                           super___mutex_base._M_mutex + lVar6 + 0x18);
            goto LAB_001a670c;
          }
        }
        uVar7 = uVar7 + 3;
        pDVar3 = t_ss[3].m_engine._M_data;
        lVar6 = lVar6 + 0x30;
      } while (uVar7 < (ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar3 >> 4));
    }
    peVar4 = (element_type *)operator_new(0x50);
    (peVar4->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar4->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_0030d160;
    (peVar4->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&peVar4->identifier = 0;
    *(undefined4 *)&(peVar4->text)._M_dataplus._M_p = 0x20;
    (peVar4->text)._M_string_length = 0;
    (peVar4->text).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(peVar4->text).field_2 + 8) = 0;
    (peVar4->location).start.line = 0;
    (peVar4->location).start.column = 0;
    *(undefined2 *)&(peVar4->location).end.line = 0;
    (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (this->super_AST_Node)._vptr_AST_Node =
         (_func_int **)
         &(peVar4->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
          super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    _Var5._M_pi = extraout_RDX;
  }
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{

          if (get_bool_condition(children[0]->eval(t_ss))) {
            return children[1]->eval(t_ss);
          } else {
            if (children.size() > 2) {
              size_t i = 2;
              while (i < children.size()) {
                if (children[i]->text == "else") {
                  return children[i+1]->eval(t_ss);
                }
                else if (children[i]->text == "else if") {
                  if (get_bool_condition(children[i+1]->eval(t_ss))) {
                    return children[i+2]->eval(t_ss);
                  }
                }
                i += 3;
              }
            }
          }

          return Boxed_Value();
        }